

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::
sequence<toml::detail::character<'#'>,_toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::character<'\t'>,_toml::detail::in_range<'_',_'~'>_>,_toml::detail::sequence<toml::detail::in_range<'\xc2',_'\xdf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xe0'>,_toml::detail::in_range<'\xa0',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xe1',_'\xec'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xed'>,_toml::detail::in_range<'\x80',_'\x9f'>_>,_toml::detail::sequence<toml::detail::in_range<'\xee',_'\xef'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<'\xf0'>,_toml::detail::in_range<'\x90',_'\xbf'>_>,_toml::detail::sequence<toml::detail::in_range<'\xf1',_'\xf3'>,_toml::detail::in_range<'\x80',_'\xbf'>_>,_toml::detail::sequence<toml::detail::character<'\xf4'>,_toml::detail::in_range<'\x80',_'\x8f'>_>_>,_toml::detail::in_range<'\x80',_'\xbf'>,_toml::detail::in_range<'\x80',_'\xbf'>_>_>,_toml::detail::unlimited>_>
::invoke(result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  value_type *pvVar1;
  const_iterator rollback;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_R8;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  result<toml::detail::region,_toml::detail::none_t> local_b8;
  location local_68;
  
  rollback._M_current = (loc->iter_)._M_current;
  character<'#'>::invoke(&local_b8,loc);
  if (local_b8.is_ok_ == false) {
    location::reset(loc,rollback);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    pvVar1 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_b8);
    region::region((region *)&local_68,pvVar1);
    sequence<toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::character<(char)9>,toml::detail::in_range<(char)32,(char)126>>,toml::detail::sequence<toml::detail::in_range<(char)-62,(char)-33>,toml::detail::in_range<(char)-128,(char)-65>>,toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<(char)-32>,toml::detail::in_range<(char)-96,(char)-65>>,toml::detail::sequence<toml::detail::in_range<(char)-31,(char)-20>,toml::detail::in_range<(char)-128,(char)-65>>,toml::detail::sequence<toml::detail::character<(char)-19>,toml::detail::in_range<(char)-128,(char)-97>>,toml::detail::sequence<toml::detail::in_range<(char)-18,(char)-17>,toml::detail::in_range<(char)-128,(char)-65>>>,toml::detail::in_range<(char)-128,(char)-65>>,toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<(char)-16>,toml::detail::in_range<(char)-112,(char)-65>>,toml::detail::sequence<toml::detail::in_range<(char)-15,(char)-13>,toml::detail::in_range<(char)-128,(char)-65>>,toml::detail::sequence<toml::detail::character<(char)-12>,toml::detail::in_range<(char)-128,(char)-113>>>,toml::detail::in_range<(char)-128,(char)-65>,toml::detail::in_range<(char)-128,(char)-65>>>,toml::detail::unlimited>>
    ::invoke<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,
               (sequence<toml::detail::repeat<toml::detail::either<toml::detail::either<toml::detail::character<(char)9>,toml::detail::in_range<(char)32,(char)126>>,toml::detail::sequence<toml::detail::in_range<(char)_62,(char)_33>,toml::detail::in_range<(char)_128,(char)_65>>,toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<(char)_32>,toml::detail::in_range<(char)_96,(char)_65>>,toml::detail::sequence<toml::detail::in_range<(char)_31,(char)_20>,toml::detail::in_range<(char)_128,(char)_65>>,toml::detail::sequence<toml::detail::character<(char)_19>,toml::detail::in_range<(char)_128,(char)_97>>,toml::detail::sequence<toml::detail::in_range<(char)_18,(char)_17>,toml::detail::in_range<(char)_128,(char)_65>>>,toml::detail::in_range<(char)_128,(char)_65>>,toml::detail::sequence<toml::detail::either<toml::detail::sequence<toml::detail::character<(char)_16>,toml::detail::in_range<(char)_112,(char)_65>>,toml::detail::sequence<toml::detail::in_range<(char)_15,(char)_13>,toml::detail::in_range<(char)_128,(char)_65>>,toml::detail::sequence<toml::detail::character<(char)_12>,toml::detail::in_range<(char)_128,(char)_113>>>,toml::detail::in_range<(char)_128,(char)_65>,toml::detail::in_range<(char)_128,(char)_65>>>,toml::detail::unlimited>>
                *)loc,&local_68,(region *)rollback._M_current,in_R8);
    region::~region((region *)&local_68);
    rollback._M_current = (char *)loc;
  }
  result<toml::detail::region,_toml::detail::none_t>::cleanup
            (&local_b8,(EVP_PKEY_CTX *)rollback._M_current);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto first = loc.iter();
        auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        return sequence<Tail...>::invoke(loc, std::move(rslt.unwrap()), first);
    }